

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_long,int>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,unsigned_long *t_lhs,
          unsigned_long *c_lhs,int *c_rhs)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong uVar3;
  undefined8 *puVar4;
  arithmetic_error *paVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  Boxed_Value BVar7;
  string local_48;
  
  switch(t_oper) {
  case equals:
    b = *c_lhs == (long)*c_rhs;
    goto LAB_001cf40b;
  case less_than:
    b = *c_lhs < (ulong)(long)*c_rhs;
    goto LAB_001cf40b;
  case greater_than:
    b = (ulong)(long)*c_rhs < *c_lhs;
    goto LAB_001cf40b;
  case less_than_equal:
    b = *c_lhs <= (ulong)(long)*c_rhs;
    goto LAB_001cf40b;
  case greater_than_equal:
    b = (ulong)(long)*c_rhs <= *c_lhs;
    goto LAB_001cf40b;
  case not_equal:
    b = *c_lhs != (long)*c_rhs;
LAB_001cf40b:
    BVar7 = const_var((chaiscript *)this,b);
    _Var6._M_pi = BVar7.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_001cf42a;
  default:
    if (t_lhs == (unsigned_long *)0x0) {
switchD_001cf47a_caseD_7:
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = &PTR__bad_cast_00236928;
      __cxa_throw(puVar4,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
    switch(t_oper) {
    case assign:
      uVar3 = (ulong)*c_rhs;
      goto LAB_001cf4f1;
    default:
      goto switchD_001cf47a_caseD_7;
    case assign_product:
      uVar3 = (long)*c_rhs * *t_lhs;
      goto LAB_001cf4f1;
    case assign_sum:
      *t_lhs = *t_lhs + (long)*c_rhs;
      break;
    case assign_quotient:
      check_divide_by_zero<int>(*c_rhs);
      uVar3 = *t_lhs / (ulong)(long)*c_rhs;
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*t_lhs % (ulong)(long)*c_rhs);
LAB_001cf4f1:
      *t_lhs = uVar3;
      break;
    case assign_difference:
      *t_lhs = *t_lhs - (long)*c_rhs;
      break;
    case assign_bitwise_and:
      check_divide_by_zero<int>(*c_rhs);
      *t_lhs = *t_lhs & (long)*c_rhs;
      _Var6._M_pi = extraout_RDX;
      break;
    case assign_bitwise_or:
      *t_lhs = *t_lhs | (long)*c_rhs;
      break;
    case assign_shift_left:
      *t_lhs = *t_lhs << ((byte)*c_rhs & 0x3f);
      break;
    case assign_shift_right:
      *t_lhs = *t_lhs >> ((byte)*c_rhs & 0x3f);
      break;
    case assign_remainder:
      iVar1 = *c_rhs;
      uVar3 = *t_lhs;
      *t_lhs = (unsigned_long)(uVar3 % (ulong)(long)iVar1);
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar3 % (ulong)(long)iVar1);
      break;
    case assign_bitwise_xor:
      *t_lhs = *t_lhs ^ (long)*c_rhs;
    }
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    goto LAB_001cf42a;
  case shift_left:
    local_48._M_dataplus._M_p = (pointer)(*c_lhs << ((byte)*c_rhs & 0x3f));
    break;
  case shift_right:
    local_48._M_dataplus._M_p = (pointer)(*c_lhs >> ((byte)*c_rhs & 0x3f));
    break;
  case remainder:
    if ((long)*c_rhs == 0) {
      paVar5 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar5,&local_48);
      __cxa_throw(paVar5,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p = (pointer)(*c_lhs % (ulong)(long)*c_rhs);
    break;
  case bitwise_and:
    local_48._M_dataplus._M_p = (pointer)((long)*c_rhs & *c_lhs);
    break;
  case bitwise_or:
    local_48._M_dataplus._M_p = (pointer)((long)*c_rhs | *c_lhs);
    break;
  case bitwise_xor:
    local_48._M_dataplus._M_p = (pointer)((long)*c_rhs ^ *c_lhs);
    break;
  case sum:
    local_48._M_dataplus._M_p = (pointer)((long)*c_rhs + *c_lhs);
    break;
  case quotient:
    if ((long)*c_rhs == 0) {
      paVar5 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar5,&local_48);
      __cxa_throw(paVar5,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p = (pointer)(*c_lhs / (ulong)(long)*c_rhs);
    break;
  case product:
    local_48._M_dataplus._M_p = (pointer)((long)*c_rhs * *c_lhs);
    break;
  case difference:
    local_48._M_dataplus._M_p = (pointer)(*c_lhs - (long)*c_rhs);
  }
  BVar7 = detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_48);
  _Var6._M_pi = BVar7.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_001cf42a:
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }